

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O0

bool __thiscall pstore::trailer::signature_is_valid(trailer *this)

{
  bool bVar1;
  bool local_21;
  trailer *this_local;
  
  bVar1 = std::operator==((array<unsigned_char,_8UL> *)this,
                          (array<unsigned_char,_8UL> *)&default_signature1);
  local_21 = true;
  if (!bVar1) {
    local_21 = std::operator==(&this->signature2,(array<unsigned_char,_8UL> *)&default_signature2);
  }
  return local_21;
}

Assistant:

bool trailer::signature_is_valid () const noexcept {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
        return a.signature1 == trailer::default_signature1 ||
               signature2 == trailer::default_signature2;
#else
        return true;
#endif
    }